

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O0

void __thiscall ProtocolARP::SendRequest(ProtocolARP *this,uint8_t *targetIP)

{
  uint8_t *puVar1;
  InterfaceMAC *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  undefined4 extraout_var_00;
  uint8_t *value;
  undefined4 extraout_var_01;
  size_t offset;
  uint8_t *targetIP_local;
  ProtocolARP *this_local;
  
  DataBuffer::Initialize(&this->ARPRequest,this->MAC);
  iVar3 = (*this->MAC->_vptr_InterfaceMAC[4])();
  (this->ARPRequest).Packet = (this->ARPRequest).Packet + CONCAT44(extraout_var,iVar3);
  iVar3 = (*this->MAC->_vptr_InterfaceMAC[4])();
  (this->ARPRequest).Remainder = (this->ARPRequest).Remainder - (short)iVar3;
  (this->ARPRequest).Disposable = false;
  sVar4 = Pack16((this->ARPRequest).Packet,0,1);
  sVar4 = Pack16((this->ARPRequest).Packet,sVar4,0x800);
  sVar4 = Pack8((this->ARPRequest).Packet,sVar4,'\x06');
  sVar4 = Pack8((this->ARPRequest).Packet,sVar4,'\x04');
  sVar4 = Pack16((this->ARPRequest).Packet,sVar4,1);
  puVar1 = (this->ARPRequest).Packet;
  iVar3 = (*this->MAC->_vptr_InterfaceMAC[5])();
  sVar4 = PackBytes(puVar1,sVar4,(uint8_t *)CONCAT44(extraout_var_00,iVar3),6);
  puVar1 = (this->ARPRequest).Packet;
  value = ProtocolIPv4::GetUnicastAddress(this->IP);
  sVar4 = PackBytes(puVar1,sVar4,value,4);
  sVar4 = PackFill((this->ARPRequest).Packet,sVar4,'\0',6);
  sVar4 = PackBytes((this->ARPRequest).Packet,sVar4,targetIP,4);
  (this->ARPRequest).Length = (uint16_t)sVar4;
  pIVar2 = this->MAC;
  iVar3 = (*this->MAC->_vptr_InterfaceMAC[6])();
  (*pIVar2->_vptr_InterfaceMAC[10])(pIVar2,this,CONCAT44(extraout_var_01,iVar3),0x806);
  return;
}

Assistant:

void ProtocolARP::SendRequest(const uint8_t* targetIP)
{
    ARPRequest.Initialize(&MAC);

    // This is normally done by the mac layer
    // but this buffer is reserved by arp and not allocated from the mac
    ARPRequest.Packet += MAC.HeaderSize();
    ARPRequest.Remainder -= MAC.HeaderSize();

    ARPRequest.Disposable = false;

    size_t offset = 0;
    offset = Pack16(ARPRequest.Packet, offset, 0x0001); // Hardware Type
    offset = Pack16(ARPRequest.Packet, offset, 0x0800); // Protocol Type
    offset = Pack8(ARPRequest.Packet, offset, 6);       // Hardware Size
    offset = Pack8(ARPRequest.Packet, offset, 4);       // Protocol Size
    offset = Pack16(ARPRequest.Packet, offset, 0x0001); // Op

    // Sender's Hardware Address
    offset = PackBytes(ARPRequest.Packet, offset, MAC.GetUnicastAddress(), 6);

    // Sender's Protocol Address
    offset = PackBytes(ARPRequest.Packet, offset, IP.GetUnicastAddress(), 4);

    // Target's Hardware Address
    offset = PackFill(ARPRequest.Packet, offset, 0, 6);

    // Target's Protocol Address
    ARPRequest.Length = PackBytes(ARPRequest.Packet, offset, targetIP, 4);

    MAC.Transmit(&ARPRequest, MAC.GetBroadcastAddress(), 0x0806);
}